

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

void test_aad96_ciphersuite(ptls_cipher_suite_t *cs1,ptls_cipher_suite_t *cs2)

{
  int iVar1;
  ptls_aead_context_t *ppVar2;
  size_t sVar3;
  size_t aadlen;
  size_t sVar4;
  size_t sVar5;
  size_t declen;
  size_t enclen;
  uint8_t seq32_bad [4];
  uint8_t seq32 [4];
  char dec [256];
  char enc [256];
  ptls_aead_context_t *c;
  char *aad;
  char *src;
  char *traffic_secret;
  ptls_cipher_suite_t *cs2_local;
  ptls_cipher_suite_t *cs1_local;
  
  enclen._4_4_ = 0xd4c3b2a1;
  enclen._0_4_ = 0xe5c4b3a2;
  ppVar2 = ptls_aead_new(cs1->aead,cs1->hash,1,"012345678901234567890123456789012345678901234567",
                         (char *)0x0);
  if (ppVar2 == (ptls_aead_context_t *)0x0) {
    __assert_fail("c != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",
                  0x159,"void test_aad96_ciphersuite(ptls_cipher_suite_t *, ptls_cipher_suite_t *)")
    ;
  }
  ptls_aead_xor_iv(ppVar2,(void *)((long)&enclen + 4),4);
  sVar3 = strlen("hello world");
  aadlen = strlen("my true aad");
  sVar4 = ptls_aead_encrypt(ppVar2,dec + 0xf8,"hello world",sVar3,0x7b,"my true aad",aadlen);
  ptls_aead_free(ppVar2);
  ppVar2 = ptls_aead_new(cs2->aead,cs2->hash,0,"012345678901234567890123456789012345678901234567",
                         (char *)0x0);
  if (ppVar2 != (ptls_aead_context_t *)0x0) {
    ptls_aead_xor_iv(ppVar2,(void *)((long)&enclen + 4),4);
    sVar3 = strlen("my true aad");
    sVar5 = ptls_aead_decrypt(ppVar2,seq32_bad,dec + 0xf8,sVar4,0x7b,"my true aad",sVar3);
    ptls_aead_xor_iv(ppVar2,(void *)((long)&enclen + 4),4);
    sVar3 = strlen("hello world");
    _ok((uint)(sVar5 == sVar3),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x165);
    iVar1 = memcmp("hello world",seq32_bad,sVar5);
    _ok((uint)(iVar1 == 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x166);
    ptls_aead_xor_iv(ppVar2,&enclen,4);
    sVar3 = strlen("my true aad");
    sVar5 = ptls_aead_decrypt(ppVar2,seq32_bad,dec + 0xf8,sVar4,0x7b,"my true aad",sVar3);
    ptls_aead_xor_iv(ppVar2,&enclen,4);
    _ok((uint)(sVar5 == 0xffffffffffffffff),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x16b);
    ptls_aead_xor_iv(ppVar2,(void *)((long)&enclen + 4),4);
    sVar3 = strlen("my true aad");
    sVar4 = ptls_aead_decrypt(ppVar2,seq32_bad,dec + 0xf8,sVar4,0x7b,"my true aad",sVar3);
    sVar3 = strlen("hello world");
    _ok((uint)(sVar4 == sVar3),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x16f);
    iVar1 = memcmp("hello world",seq32_bad,sVar4);
    _ok((uint)(iVar1 == 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x170);
    ptls_aead_free(ppVar2);
    return;
  }
  __assert_fail("c != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x160,
                "void test_aad96_ciphersuite(ptls_cipher_suite_t *, ptls_cipher_suite_t *)");
}

Assistant:

static void test_aad96_ciphersuite(ptls_cipher_suite_t *cs1, ptls_cipher_suite_t *cs2)
{
    const char *traffic_secret = "012345678901234567890123456789012345678901234567", *src = "hello world", *aad = "my true aad";
    ptls_aead_context_t *c;
    char enc[256], dec[256];
    uint8_t seq32[4] = {0xa1, 0xb2, 0xc3, 0xd4};
    uint8_t seq32_bad[4] = {0xa2, 0xb3, 0xc4, 0xe5};
    size_t enclen, declen;

    /* encrypt */
    c = ptls_aead_new(cs1->aead, cs1->hash, 1, traffic_secret, NULL);
    assert(c != NULL);
    ptls_aead_xor_iv(c, seq32, sizeof(seq32));
    enclen = ptls_aead_encrypt(c, enc, src, strlen(src), 123, aad, strlen(aad));
    ptls_aead_free(c);

    /* decrypt */
    c = ptls_aead_new(cs2->aead, cs2->hash, 0, traffic_secret, NULL);
    assert(c != NULL);
    /* test first decryption */
    ptls_aead_xor_iv(c, seq32, sizeof(seq32));
    declen = ptls_aead_decrypt(c, dec, enc, enclen, 123, aad, strlen(aad));
    ptls_aead_xor_iv(c, seq32, sizeof(seq32));
    ok(declen == strlen(src));
    ok(memcmp(src, dec, declen) == 0);
    /* test that setting the wrong IV creates an error */
    ptls_aead_xor_iv(c, seq32_bad, sizeof(seq32_bad));
    declen = ptls_aead_decrypt(c, dec, enc, enclen, 123, aad, strlen(aad));
    ptls_aead_xor_iv(c, seq32_bad, sizeof(seq32_bad));
    ok(declen == SIZE_MAX);
    /* test second decryption with correct IV to verify no side effect */
    ptls_aead_xor_iv(c, seq32, sizeof(seq32));
    declen = ptls_aead_decrypt(c, dec, enc, enclen, 123, aad, strlen(aad));
    ok(declen == strlen(src));
    ok(memcmp(src, dec, declen) == 0);
    ptls_aead_free(c);
}